

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O0

void ImPlot::LabelTickTime
               (ImPlotTick *tick,ImGuiTextBuffer *buffer,ImPlotTime *t,ImPlotDateTimeFmt fmt)

{
  int iVar1;
  size_t sVar2;
  undefined4 in_R9D;
  ImVec2 IVar3;
  ImPlotDateTimeFmt fmt_00;
  undefined1 local_68 [8];
  char temp [32];
  ImPlotTime *t_local;
  ImGuiTextBuffer *buffer_local;
  ImPlotTick *tick_local;
  ImPlotDateTimeFmt fmt_local;
  
  fmt_00.Date = fmt._8_4_;
  if ((tick->ShowLabel & 1U) != 0) {
    iVar1 = ImGuiTextBuffer::size(buffer);
    tick->TextOffset = iVar1;
    fmt_00.Time = 0;
    fmt_00.UseISO8601 = (bool)(char)in_R9D;
    fmt_00.Use24HourClock = (bool)(char)((uint)in_R9D >> 8);
    fmt_00._10_2_ = (short)((uint)in_R9D >> 0x10);
    FormatDateTime((ImPlot *)t,(ImPlotTime *)local_68,(char *)0x20,fmt.Date,fmt_00);
    sVar2 = strlen((char *)local_68);
    ImGuiTextBuffer::append(buffer,(char *)local_68,local_68 + sVar2 + 1);
    IVar3 = ImGui::CalcTextSize((buffer->Buf).Data + tick->TextOffset,(char *)0x0,false,-1.0);
    tick->LabelSize = IVar3;
  }
  return;
}

Assistant:

inline void LabelTickTime(ImPlotTick& tick, ImGuiTextBuffer& buffer, const ImPlotTime& t, ImPlotDateTimeFmt fmt) {
    char temp[32];
    if (tick.ShowLabel) {
        tick.TextOffset = buffer.size();
        FormatDateTime(t, temp, 32, fmt);
        buffer.append(temp, temp + strlen(temp) + 1);
        tick.LabelSize = ImGui::CalcTextSize(buffer.Buf.Data + tick.TextOffset);
    }
}